

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ip_filter.hpp
# Opt level: O0

void __thiscall
libtorrent::detail::filter_impl<unsigned_short>::filter_impl(filter_impl<unsigned_short> *this)

{
  uint16_t addr;
  range local_18;
  filter_impl<unsigned_short> *local_10;
  filter_impl<unsigned_short> *this_local;
  
  local_10 = this;
  std::
  set<libtorrent::detail::filter_impl<unsigned_short>::range,_std::less<libtorrent::detail::filter_impl<unsigned_short>::range>,_std::allocator<libtorrent::detail::filter_impl<unsigned_short>::range>_>
  ::set(&this->m_access_list);
  addr = zero<unsigned_short>();
  range::range(&local_18,addr,0);
  std::
  set<libtorrent::detail::filter_impl<unsigned_short>::range,_std::less<libtorrent::detail::filter_impl<unsigned_short>::range>,_std::allocator<libtorrent::detail::filter_impl<unsigned_short>::range>_>
  ::insert(&this->m_access_list,&local_18);
  return;
}

Assistant:

filter_impl()
		{
			// make the entire ip-range non-blocked
			m_access_list.insert(range(zero<Addr>(), 0));
		}